

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void __thiscall LeakTest_Test1_Test::LeakTest_Test1_Test(LeakTest_Test1_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00189aa8;
  return;
}

Assistant:

TEST(LeakTest, Test1){
    CtorTotCounter = 0;
    CtorGoodCounter = 0;
    CtorBadCounter = 0;
    GoodClass::counter = 0;
    {
        Infector::Container ioc;
        ioc.bindAsNothing<BadClass>();
        ioc.bindAsNothing<GoodClass>();
        ioc.bindAsNothing<GB>();
        ioc.bindAsNothing<BG>();
        ioc.wire<BadClass>();
        ioc.wire<GoodClass>();
        // C++ make no assumption about evaluation order of parameters
        // so I must test both orders.. and there's no guarantee that
        // evaluation order will be the same between 2 calls, so manual
        // attention must be paid here.
        ioc.wire<BG       ,BadClass,GoodClass>();
        ioc.wire<GB       ,GoodClass,BadClass>();
        //std::cout<<"\n3 CONSTRUCTORS CALLS MUST BE DISPLAYED:\n"<<std::endl;
        try{
        auto a = ioc.build<BG>();
        }catch(std::exception ex){

        }
        //std::cout<<"2nd call"<<std::endl;
        try{
        auto b = ioc.build<GB>();
        }catch(std::exception ex){

        }
    }
    EXPECT_EQ(0, GoodClass::counter); // TEST MEMORY LEAK
    EXPECT_EQ(3, CtorTotCounter);
    EXPECT_TRUE(CtorBadCounter > 0 && CtorGoodCounter > 0);
    GoodClass::counter = 0;
    CtorTotCounter = 0;
    CtorBadCounter = 0;
    CtorGoodCounter = 0;
}